

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

pair<ParserProbModelXML::elm_type,_unsigned_int> __thiscall
ParserProbModelXML::GetParsedElement(ParserProbModelXML *this,string *name)

{
  const_iterator cVar1;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar2;
  EParse *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
          ::find(&(this->_m_parsedElements)._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(this->_m_parsedElements)._M_t._M_impl.super__Rb_tree_header) {
    pVar2.first = cVar1._M_node[2]._M_color;
    pVar2.second = *(uint *)&cVar1._M_node[2].field_0x4;
    return pVar2;
  }
  this_00 = (EParse *)__cxa_allocate_exception(0x28);
  std::operator+(&bStack_58,"Requested undefined variable \"",name);
  std::operator+(&local_38,&bStack_58,"\".");
  EParse::EParse(this_00,&local_38);
  __cxa_throw(this_00,&EParse::typeinfo,E::~E);
}

Assistant:

const std::pair<ParserProbModelXML::elm_type, Index> ParserProbModelXML::GetParsedElement(const std::string name) const
{
    map<string, pair<elm_type, Index> >::const_iterator it = _m_parsedElements.find(name);

    if(it == _m_parsedElements.end())
    {
        throw EParse("Requested undefined variable \"" + name + "\".");
    }

    return it->second;
}